

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlNewInputFromFile(void)

{
  int iVar1;
  int iVar2;
  xmlParserCtxtPtr val;
  char *val_00;
  xmlParserInputPtr val_01;
  int local_34;
  int n_filename;
  char *filename;
  int n_ctxt;
  xmlParserCtxtPtr ctxt;
  xmlParserInputPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (filename._4_4_ = 0; (int)filename._4_4_ < 3; filename._4_4_ = filename._4_4_ + 1) {
    for (local_34 = 0; local_34 < 8; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_xmlParserCtxtPtr(filename._4_4_,0);
      val_00 = gen_filepath(local_34,1);
      val_01 = (xmlParserInputPtr)xmlNewInputFromFile(val,val_00);
      desret_xmlParserInputPtr(val_01);
      call_tests = call_tests + 1;
      des_xmlParserCtxtPtr(filename._4_4_,val,0);
      des_filepath(local_34,val_00,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewInputFromFile",(ulong)(uint)(iVar2 - iVar1));
        ret_val._4_4_ = ret_val._4_4_ + 1;
        printf(" %d",(ulong)filename._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlNewInputFromFile(void) {
    int test_ret = 0;

    int mem_base;
    xmlParserInputPtr ret_val;
    xmlParserCtxtPtr ctxt; /* an XML parser context */
    int n_ctxt;
    const char * filename; /* the filename to use as entity */
    int n_filename;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlParserCtxtPtr;n_ctxt++) {
    for (n_filename = 0;n_filename < gen_nb_filepath;n_filename++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlParserCtxtPtr(n_ctxt, 0);
        filename = gen_filepath(n_filename, 1);

        ret_val = xmlNewInputFromFile(ctxt, filename);
        desret_xmlParserInputPtr(ret_val);
        call_tests++;
        des_xmlParserCtxtPtr(n_ctxt, ctxt, 0);
        des_filepath(n_filename, filename, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlNewInputFromFile",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_filename);
            printf("\n");
        }
    }
    }
    function_tests++;

    return(test_ret);
}